

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CalculateEcSignatureRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::CalculateEcSignatureRequestStruct,cfd::js::api::SignatureDataResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_5e8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_530 [4];
  JsonClassBase<cfd::js::api::json::SignatureDataResponse> local_510 [4];
  undefined1 local_4f0 [8];
  SignatureDataResponse res_2;
  undefined1 local_490 [8];
  SignatureDataResponseStruct response;
  CalculateEcSignatureRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_108 [8];
  CalculateEcSignatureRequest req;
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._224_8_ = call_function;
  CalculateEcSignatureRequest::CalculateEcSignatureRequest((CalculateEcSignatureRequest *)local_108)
  ;
  core::JsonClassBase<cfd::js::api::json::CalculateEcSignatureRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CalculateEcSignatureRequest> *)local_108,
             request_message);
  CalculateEcSignatureRequest::ConvertToStruct
            ((CalculateEcSignatureRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CalculateEcSignatureRequest *)local_108);
  std::
  function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::CalculateEcSignatureRequestStruct_&)>
  ::operator()((SignatureDataResponseStruct *)local_490,call_function,
               (CalculateEcSignatureRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    SignatureDataResponse::SignatureDataResponse((SignatureDataResponse *)local_4f0);
    SignatureDataResponse::ConvertFromStruct
              ((SignatureDataResponse *)local_4f0,(SignatureDataResponseStruct *)local_490);
    core::JsonClassBase<cfd::js::api::json::SignatureDataResponse>::Serialize_abi_cxx11_(local_510);
    std::__cxx11::string::operator=((string *)this,(string *)local_510);
    std::__cxx11::string::~string((string *)local_510);
    SignatureDataResponse::~SignatureDataResponse((SignatureDataResponse *)local_4f0);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_5e8,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_530);
    std::__cxx11::string::operator=((string *)this,(string *)local_530);
    std::__cxx11::string::~string((string *)local_530);
    ErrorResponse::~ErrorResponse(&local_5e8);
  }
  res_2._87_1_ = 1;
  SignatureDataResponseStruct::~SignatureDataResponseStruct
            ((SignatureDataResponseStruct *)local_490);
  CalculateEcSignatureRequestStruct::~CalculateEcSignatureRequestStruct
            ((CalculateEcSignatureRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CalculateEcSignatureRequest::~CalculateEcSignatureRequest
            ((CalculateEcSignatureRequest *)local_108);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}